

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void Mean16x4_C(uint8_t *ref,uint32_t *dc)

{
  int k;
  long lVar1;
  long lVar2;
  uint8_t *puVar3;
  uint32_t avg;
  uint32_t uVar4;
  long lVar5;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    uVar4 = 0;
    puVar3 = ref;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        uVar4 = uVar4 + puVar3[lVar5];
      }
      puVar3 = puVar3 + 0x20;
    }
    dc[lVar1] = uVar4;
    ref = ref + 4;
  }
  return;
}

Assistant:

static void Mean16x4_C(const uint8_t* WEBP_RESTRICT ref, uint32_t dc[4]) {
  int k, x, y;
  for (k = 0; k < 4; ++k) {
    uint32_t avg = 0;
    for (y = 0; y < 4; ++y) {
      for (x = 0; x < 4; ++x) {
        avg += ref[x + y * BPS];
      }
    }
    dc[k] = avg;
    ref += 4;   // go to next 4x4 block.
  }
}